

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkCollectObjects(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  Abc_Obj_t *Entry;
  int i;
  
  p = Vec_PtrAlloc(100);
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    Entry = Abc_NtkObj(pNtk,i);
    if (Entry != (Abc_Obj_t *)0x0) {
      Vec_PtrPush(p,Entry);
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectObjects( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_PtrPush( vNodes, pNode );
    return vNodes;
}